

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<9992,Blob<256>>
               (hashfunc<Blob<256>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  size_type sVar3;
  byte in_CL;
  uint in_EDX;
  char *pcVar4;
  uint in_ESI;
  byte in_R8B;
  byte in_R9B;
  bool result;
  Blob<256> h;
  keytype k;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> hashes;
  undefined3 uVar5;
  undefined4 in_stack_fffffffffffffac0;
  byte bVar7;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffac4;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_stack_fffffffffffffad0;
  Blob<9992> *in_stack_fffffffffffffad8;
  undefined1 in_stack_fffffffffffffae7;
  int in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaec;
  pfHash in_stack_fffffffffffffaf0;
  uint8_t in_stack_fffffffffffffbcb;
  uint8_t in_stack_fffffffffffffbcc;
  uint8_t in_stack_fffffffffffffbcd;
  uint8_t in_stack_fffffffffffffbce;
  uint8_t in_stack_fffffffffffffbcf;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_stack_fffffffffffffbd0;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_10 = in_R9B & 1;
  pcVar4 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar4 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x2708,pcVar4,(ulong)in_ESI);
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)0x19a18f);
  Blob<9992>::Blob((Blob<9992> *)&stack0xfffffffffffffaf7);
  memset(&stack0xfffffffffffffaf7,0,0x4e1);
  if ((local_d & 1) != 0) {
    Blob<256>::Blob((Blob<256> *)&stack0xfffffffffffffac4);
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    (*p_Var2)(&stack0xfffffffffffffaf7,0x4e1,0,&stack0xfffffffffffffac4);
    std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::push_back
              ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)
               CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
               (value_type *)CONCAT44(in_ESI,in_EDX));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<9992>,Blob<256>>
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec,in_stack_fffffffffffffae8,
             (bool)in_stack_fffffffffffffae7,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  sVar3 = std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::size(&local_28);
  printf("%d keys\n",sVar3 & 0xffffffff);
  uVar5 = (undefined3)in_stack_fffffffffffffac0;
  bVar7 = 1;
  bVar1 = TestHashList<Blob<256>>
                    (in_stack_fffffffffffffbd0,(bool)in_stack_fffffffffffffbcf,
                     (bool)in_stack_fffffffffffffbce,(bool)in_stack_fffffffffffffbcd,
                     (bool)in_stack_fffffffffffffbcc,(bool)in_stack_fffffffffffffbcb);
  uVar6 = CONCAT13(bVar1 & bVar7,uVar5);
  printf("\n");
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::~vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)
             CONCAT44(in_stack_fffffffffffffac4,uVar6));
  return (bool)((byte)((uint)uVar6 >> 0x18) & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}